

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::RawHashSamplerTest_DISABLED_Sample_Test::TestBody
          (RawHashSamplerTest_DISABLED_Sample_Test *this)

{
  size_t this_00;
  bool bVar1;
  HashtablezSampler *this_01;
  int64_t iVar2;
  raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
  *this_02;
  long lVar3;
  size_type sVar4;
  char *message;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  AssertHelper local_e0;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar;
  function<void_(const_phmap::priv::HashtablezInfo_&)> local_b8;
  long local_98;
  size_t end_size;
  int local_78;
  int local_74;
  undefined1 local_70 [4];
  int i;
  vector<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
  tables;
  anon_class_8_1_3fb38b7c local_48;
  function<void_(const_phmap::priv::HashtablezInfo_&)> local_40;
  size_t local_20;
  size_t start_size;
  HashtablezSampler *sampler;
  RawHashSamplerTest_DISABLED_Sample_Test *this_local;
  
  sampler = (HashtablezSampler *)this;
  SetHashtablezEnabled(true);
  SetHashtablezSampleParameter(100);
  this_01 = HashtablezSampler::Global();
  local_20 = 0;
  local_48.start_size = &local_20;
  start_size = (size_t)this_01;
  std::function<void(phmap::priv::HashtablezInfo_const&)>::
  function<phmap::priv::(anonymous_namespace)::RawHashSamplerTest_DISABLED_Sample_Test::TestBody()::__0,void>
            ((function<void(phmap::priv::HashtablezInfo_const&)> *)&local_40,&local_48);
  iVar2 = HashtablezSampler::Iterate(this_01,&local_40);
  local_20 = iVar2 + local_20;
  std::function<void_(const_phmap::priv::HashtablezInfo_&)>::~function(&local_40);
  std::
  vector<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
  ::vector((vector<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
            *)local_70);
  for (local_74 = 0; this_00 = start_size, local_74 < 1000000; local_74 = local_74 + 1) {
    std::
    vector<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
    ::emplace_back<>((vector<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
                      *)local_70);
    this_02 = &std::
               vector<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
               ::back((vector<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
                       *)local_70)->
               super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
    ;
    local_78 = 1;
    raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
    ::insert<int,_0,_0,_nullptr>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>::iterator,_bool>
                *)&end_size,this_02,&local_78);
  }
  local_98 = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )&local_98;
  std::function<void(phmap::priv::HashtablezInfo_const&)>::
  function<phmap::priv::(anonymous_namespace)::RawHashSamplerTest_DISABLED_Sample_Test::TestBody()::__1,void>
            ((function<void(phmap::priv::HashtablezInfo_const&)> *)&local_b8,
             (anon_class_8_1_4ec58663 *)&gtest_ar.message_);
  iVar2 = HashtablezSampler::Iterate((HashtablezSampler *)this_00,&local_b8);
  local_98 = local_98 + iVar2;
  std::function<void_(const_phmap::priv::HashtablezInfo_&)>::~function(&local_b8);
  lVar3 = local_98 - local_20;
  auVar5._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar5._0_8_ = lVar3;
  auVar5._12_4_ = 0x45300000;
  sVar4 = std::
          vector<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
          ::size((vector<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
                  *)local_70);
  auVar6._8_4_ = (int)(sVar4 >> 0x20);
  auVar6._0_8_ = sVar4;
  auVar6._12_4_ = 0x45300000;
  testing::internal::DoubleNearPredFormat
            ((internal *)local_d0,"(end_size - start_size) / static_cast<double>(tables.size())",
             "0.01","0.005",
             ((auVar5._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) /
             ((auVar6._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)),0.01,0.005);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x757,message);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  std::
  vector<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
  ::~vector((vector<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
             *)local_70);
  return;
}

Assistant:

TEST(RawHashSamplerTest, DISABLED_Sample) {
  // Enable the feature even if the prod default is off.
  SetHashtablezEnabled(true);
  SetHashtablezSampleParameter(100);

  auto& sampler = HashtablezSampler::Global();
  size_t start_size = 0;
  start_size += sampler.Iterate([&](const HashtablezInfo&) { ++start_size; });

  std::vector<IntTable> tables;
  for (int i = 0; i < 1000000; ++i) {
    tables.emplace_back();
    tables.back().insert(1);
  }
  size_t end_size = 0;
  end_size += sampler.Iterate([&](const HashtablezInfo&) { ++end_size; });

  EXPECT_NEAR((end_size - start_size) / static_cast<double>(tables.size()),
              0.01, 0.005);
}